

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmMakefile *mf,cmGeneratedFileStream *fout)

{
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar6;
  reference ppcVar7;
  cmMakefile *this_00;
  cmTargets *this_01;
  pointer pvVar8;
  long lVar9;
  reference target;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  const_iterator fit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string fastTarget;
  string local_1f0;
  char *local_1d0;
  char *editCommand;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  _Stack_1c0;
  bool insertTarget;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_1b8;
  const_iterator ti;
  undefined1 local_1a8 [6];
  bool topLevel;
  string currentDir;
  cmMakefile *makefile;
  cmTargets *targets;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_170;
  const_iterator it;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  char *local_c8;
  char *homeOutputDir;
  string local_b8;
  undefined1 local_98 [8];
  string makeArgs;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string make;
  cmGeneratedFileStream *fout_local;
  cmMakefile *mf_local;
  cmExtraKateGenerator *this_local;
  
  make.field_2._8_8_ = fout;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_MAKE_PROGRAM",&local_61);
  pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_40,pcVar4,(allocator *)(makeArgs.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator *)((long)&homeOutputDir + 7)
            );
  pcVar4 = cmMakefile::GetSafeDefinition(mf,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,pcVar4,(allocator *)((long)&homeOutputDir + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 6));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&homeOutputDir + 7));
  local_c8 = cmMakefile::GetHomeOutputDirectory(mf);
  poVar5 = std::operator<<((ostream *)make.field_2._8_8_,"\t\"build\": {\n\t\t\"directory\": \"");
  pcVar4 = cmMakefile::GetHomeOutputDirectory(mf);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::operator<<(poVar5,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar5 = std::operator<<((ostream *)make.field_2._8_8_,"\t\t\"build\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_40);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_c8);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_98);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"all\",\n");
  poVar5 = std::operator<<((ostream *)make.field_2._8_8_,"\t\t\"clean\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_40);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_c8);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_98);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"clean\",\n");
  poVar5 = std::operator<<((ostream *)make.field_2._8_8_,"\t\t\"quick\": \"");
  poVar5 = std::operator<<(poVar5,(string *)local_40);
  poVar5 = std::operator<<(poVar5," -C \\\"");
  poVar5 = std::operator<<(poVar5,local_c8);
  poVar5 = std::operator<<(poVar5,"\\\" ");
  poVar5 = std::operator<<(poVar5,(string *)local_98);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"install\",\n");
  std::operator<<((ostream *)make.field_2._8_8_,"\t\t\"targets\":[\n");
  uVar1 = make.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"all",&local_e9);
  pcVar4 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,pcVar4,&local_111);
  AppendTarget(this,(cmGeneratedFileStream *)uVar1,&local_e8,(string *)local_40,(string *)local_98,
               &local_110,local_c8);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  uVar1 = make.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"clean",&local_139);
  pcVar4 = local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,pcVar4,(allocator *)((long)&it._M_current + 7));
  AppendTarget(this,(cmGeneratedFileStream *)uVar1,&local_138,(string *)local_40,(string *)local_98,
               &local_160,local_c8);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pvVar6 = cmGlobalGenerator::GetLocalGenerators
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_170._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar6);
  do {
    pvVar6 = cmGlobalGenerator::GetLocalGenerators
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    targets = (cmTargets *)
              std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar6);
    bVar2 = __gnu_cxx::operator!=
                      (&local_170,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&targets);
    if (!bVar2) {
      std::operator<<((ostream *)make.field_2._8_8_,"\t] }\n");
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_40);
      return;
    }
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_170);
    this_00 = cmLocalGenerator::GetMakefile(*ppcVar7);
    this_01 = cmMakefile::GetTargets_abi_cxx11_(this_00);
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_170);
    currentDir.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar7);
    pcVar4 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)currentDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1a8,pcVar4,
               (allocator *)
               ((long)&ti.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ti.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 7));
    pcVar4 = cmMakefile::GetHomeOutputDirectory((cmMakefile *)currentDir.field_2._8_8_);
    ti.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
    ._M_cur._6_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,pcVar4);
    local_1b8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin(this_01);
    while( true ) {
      _Stack_1c0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::end(this_01);
      bVar2 = std::__detail::operator!=(&local_1b8,&stack0xfffffffffffffe40);
      if (!bVar2) break;
      pvVar8 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_1b8);
      TVar3 = cmTarget::GetType(&pvVar8->second);
      uVar1 = make.field_2._8_8_;
      if (TVar3 < UTILITY) {
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        AppendTarget(this,(cmGeneratedFileStream *)uVar1,&pvVar8->first,(string *)local_40,
                     (string *)local_98,(string *)local_1a8,local_c8);
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        std::__cxx11::string::string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar8);
        std::__cxx11::string::operator+=
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"/fast");
        AppendTarget(this,(cmGeneratedFileStream *)make.field_2._8_8_,
                     (string *)
                     &objectFileTargets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_40,
                     (string *)local_98,(string *)local_1a8,local_c8);
        std::__cxx11::string::~string
                  ((string *)
                   &objectFileTargets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (TVar3 == UTILITY) {
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        lVar9 = std::__cxx11::string::find((char *)pvVar8,0x8e2869);
        if (lVar9 == 0) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_1b8);
          bVar2 = std::operator!=(&pvVar8->first,"Nightly");
          if (bVar2) goto LAB_005af975;
        }
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        lVar9 = std::__cxx11::string::find((char *)pvVar8,0x8e2871);
        if (lVar9 == 0) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_1b8);
          bVar2 = std::operator!=(&pvVar8->first,"Continuous");
          if (bVar2) goto LAB_005af975;
        }
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        lVar9 = std::__cxx11::string::find((char *)pvVar8,0x8e287c);
        if (lVar9 == 0) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_1b8);
          bVar2 = std::operator!=(&pvVar8->first,"Experimental");
          if (bVar2) goto LAB_005af975;
        }
        uVar1 = make.field_2._8_8_;
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_1b8);
        AppendTarget(this,(cmGeneratedFileStream *)uVar1,&pvVar8->first,(string *)local_40,
                     (string *)local_98,(string *)local_1a8,local_c8);
      }
      else if (TVar3 == GLOBAL_TARGET) {
        editCommand._7_1_ = 0;
        if ((ti.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur._6_1_ & 1) != 0) {
          editCommand._7_1_ = 1;
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_1b8);
          bVar2 = std::operator==(&pvVar8->first,"edit_cache");
          uVar1 = currentDir.field_2._8_8_;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1f0,"CMAKE_EDIT_COMMAND",
                       (allocator *)(fastTarget.field_2._M_local_buf + 0xf));
            pcVar4 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(fastTarget.field_2._M_local_buf + 0xf));
            local_1d0 = pcVar4;
            if (pcVar4 == (char *)0x0) {
              editCommand._7_1_ = 0;
            }
            else {
              pcVar4 = strstr(pcVar4,"ccmake");
              if (pcVar4 != (char *)0x0) {
                editCommand._7_1_ = 0;
              }
            }
          }
        }
        uVar1 = make.field_2._8_8_;
        if ((editCommand._7_1_ & 1) != 0) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_1b8);
          AppendTarget(this,(cmGeneratedFileStream *)uVar1,&pvVar8->first,(string *)local_40,
                       (string *)local_98,(string *)local_1a8,local_c8);
        }
      }
LAB_005af975:
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_1b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&fit);
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_170);
    (*(*ppcVar7)->_vptr_cmLocalGenerator[0xb])
              (*ppcVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fit);
    local_240._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fit);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_238,&local_240);
    while( true ) {
      local_248._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fit);
      bVar2 = __gnu_cxx::operator!=(&local_238,&local_248);
      uVar1 = make.field_2._8_8_;
      if (!bVar2) break;
      target = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_238);
      AppendTarget(this,(cmGeneratedFileStream *)uVar1,target,(string *)local_40,(string *)local_98,
                   (string *)local_1a8,local_c8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_238);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fit);
    std::__cxx11::string::~string((string *)local_1a8);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_170);
  } while( true );
}

Assistant:

void
cmExtraKateGenerator::WriteTargets(const cmMakefile* mf,
                                   cmGeneratedFileStream& fout) const
{
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
    "CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = mf->GetHomeOutputDirectory();

  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << mf->GetHomeOutputDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "install\",\n";

  // this is for kate >= 4.13:
  fout <<
  "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs,
                     homeOutputDir, homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs,
                     homeOutputDir, homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator
       it = this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end();
       ++it)
    {
    const cmTargets& targets = (*it)->GetMakefile()->GetTargets();
    cmMakefile* makefile=(*it)->GetMakefile();
    std::string currentDir = makefile->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == makefile->GetHomeOutputDirectory());

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end(); ++ti)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel)
            {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (ti->first == "edit_cache")
              {
              const char* editCommand = makefile->GetDefinition
              ("CMAKE_EDIT_COMMAND");
              if (editCommand == 0)
                {
                insertTarget = false;
                }
              else if (strstr(editCommand, "ccmake")!=NULL)
                {
                insertTarget = false;
                }
              }
            }
          if (insertTarget)
            {
            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
            }
        }
        break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
            || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
            || ((ti->first.find("Experimental")==0)
            && (ti->first!="Experimental")))
            {
              break;
            }

            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        {
          this->AppendTarget(fout, ti->first, make, makeArgs,
                             currentDir, homeOutputDir);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs,
                             currentDir, homeOutputDir);

        }
        break;
        default:
          break;
      }
    }

    //insert rules for compiling, preprocessing and assembling individual files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for(std::vector<std::string>::const_iterator fit=objectFileTargets.begin();
        fit != objectFileTargets.end();
        ++fit)
      {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,homeOutputDir);
      }
  }

  fout <<
  "\t] }\n";
}